

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O1

void ghod_hitsu(monst *priest)

{
  xchar bx;
  char by;
  char cVar1;
  level *plVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  int dy;
  char *pcVar6;
  char *line;
  xchar xVar7;
  char cVar8;
  char cVar9;
  
  if (u.urooms[0] != '\0') {
    pcVar6 = u.urooms;
    cVar8 = u.urooms[0];
    do {
      pcVar6 = pcVar6 + 1;
      if (*(char *)((long)level->monsters + (long)cVar8 * 0xd8 + 0x335c) == '\n') goto LAB_00229091;
      cVar8 = *pcVar6;
    } while (cVar8 != '\0');
  }
  cVar8 = '\0';
LAB_00229091:
  if ((cVar8 == '\0') || (bVar3 = has_shrine(priest), plVar2 = level, bVar3 == '\0')) {
    return;
  }
  bx = priest->field_0x76;
  by = priest->field_0x77;
  if ((by == u.uy && u.ux == bx) ||
     (bVar3 = linedup(u.ux,u.uy,bx,by), cVar9 = bx, xVar7 = by, bVar3 == '\0')) {
    pcVar6 = (char *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x3358);
    if (level->locations[u.ux][u.uy].typ == '\x17') {
      cVar1 = *pcVar6;
      cVar9 = *(char *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x3359);
      xVar7 = u.uy;
      if ((cVar1 + -1 != (int)u.ux) && (iVar5 = (int)cVar9, cVar9 = cVar1, iVar5 + 1 != (int)u.ux))
      {
        cVar1 = *(char *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x335a);
        cVar8 = *(char *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x335b);
        cVar9 = u.ux;
        xVar7 = cVar8;
        if ((cVar1 + -1 != (int)u.uy) && (xVar7 = cVar1, cVar8 + 1 != (int)u.uy)) {
          cVar9 = bx;
          xVar7 = by;
        }
      }
    }
    else {
      uVar4 = mt_random();
      cVar9 = u.ux;
      xVar7 = u.uy;
      switch(uVar4 & 3) {
      case 0:
        xVar7 = *(xchar *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x335a);
        break;
      case 1:
        xVar7 = *(xchar *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x335b);
        break;
      case 2:
        cVar9 = *pcVar6;
        break;
      case 3:
        cVar9 = *(xchar *)((long)plVar2->monsters + (long)cVar8 * 0xd8 + 0x3359);
      }
    }
    bVar3 = linedup(u.ux,u.uy,cVar9,xVar7);
    if (bVar3 == '\0') {
      return;
    }
  }
  uVar4 = mt_random();
  pcVar6 = a_gname_at(bx,by);
  if (uVar4 % 3 == 1) {
    pcVar6 = s_suffix(pcVar6);
    line = "%s voice booms:  \"How darest thou harm my servant!\"";
  }
  else if (uVar4 % 3 == 0) {
    line = "%s roars in anger:  \"Thou shalt suffer!\"";
  }
  else {
    line = "%s roars:  \"Thou dost profane my shrine!\"";
  }
  pline(line,pcVar6);
  iVar5 = sgn((int)tbx);
  dy = sgn((int)tby);
  buzz(-0xf,6,cVar9,xVar7,iVar5,dy);
  exercise(2,'\0');
  return;
}

Assistant:

void ghod_hitsu(struct monst *priest)
{
	int x, y, ax, ay, roomno = (int)temple_occupied(u.urooms);
	struct mkroom *troom;

	if (!roomno || !has_shrine(priest))
		return;

	ax = x = EPRI(priest)->shrpos.x;
	ay = y = EPRI(priest)->shrpos.y;
	troom = &level->rooms[roomno - ROOMOFFSET];

	if ((u.ux == x && u.uy == y) || !linedup(u.ux, u.uy, x, y)) {
	    if (IS_DOOR(level->locations[u.ux][u.uy].typ)) {

		if (u.ux == troom->lx - 1) {
		    x = troom->hx;
		    y = u.uy;
		} else if (u.ux == troom->hx + 1) {
		    x = troom->lx;
		    y = u.uy;
		} else if (u.uy == troom->ly - 1) {
		    x = u.ux;
		    y = troom->hy;
		} else if (u.uy == troom->hy + 1) {
		    x = u.ux;
		    y = troom->ly;
		}
	    } else {
		switch(rn2(4)) {
		case 0:  x = u.ux; y = troom->ly; break;
		case 1:  x = u.ux; y = troom->hy; break;
		case 2:  x = troom->lx; y = u.uy; break;
		default: x = troom->hx; y = u.uy; break;
		}
	    }
	    if (!linedup(u.ux, u.uy, x, y)) return;
	}

	switch(rn2(3)) {
	case 0:
	    pline("%s roars in anger:  \"Thou shalt suffer!\"",
			a_gname_at(ax, ay));
	    break;
	case 1:
	    pline("%s voice booms:  \"How darest thou harm my servant!\"",
			s_suffix(a_gname_at(ax, ay)));
	    break;
	default:
	    pline("%s roars:  \"Thou dost profane my shrine!\"",
			a_gname_at(ax, ay));
	    break;
	}

	buzz(-10-(AD_ELEC-1), 6, x, y, sgn(tbx), sgn(tby)); /* bolt of lightning */
	exercise(A_WIS, FALSE);
}